

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O0

int __thiscall
CGraphics_Threaded::LoadTextureRawSub
          (CGraphics_Threaded *this,CTextureHandle TextureID,int x,int y,int Width,int Height,
          int Format,void *pData)

{
  bool bVar1;
  int iVar2;
  CCommandBuffer *in_RDI;
  int in_R8D;
  int in_R9D;
  long in_FS_OFFSET;
  int in_stack_00000008;
  void *pTmpData;
  int MemSize;
  CTextureUpdateCommand Cmd;
  void *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  CTextureHandle local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = IGraphics::CTextureHandle::IsValid((CTextureHandle *)0x12eb3a);
  if (bVar1) {
    CCommandBuffer::CTextureUpdateCommand::CTextureUpdateCommand((CTextureUpdateCommand *)0x12eb55);
    IGraphics::CTextureHandle::Id(&local_c);
    ImageFormatToTexFormat(in_stack_00000008);
    iVar2 = in_R8D * in_R9D;
    CImageInfo::GetPixelSize(in_stack_00000008);
    mem_alloc(0);
    mem_copy((void *)CONCAT44(iVar2,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78,0);
    CCommandBuffer::AddCommand<CCommandBuffer::CTextureUpdateCommand>
              (in_RDI,(CTextureUpdateCommand *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return 0;
}

Assistant:

int CGraphics_Threaded::LoadTextureRawSub(CTextureHandle TextureID, int x, int y, int Width, int Height, int Format, const void *pData)
{
	if(!TextureID.IsValid())
		return 0;

	CCommandBuffer::CTextureUpdateCommand Cmd;
	Cmd.m_Slot = TextureID.Id();
	Cmd.m_X = x;
	Cmd.m_Y = y;
	Cmd.m_Width = Width;
	Cmd.m_Height = Height;
	Cmd.m_Format = ImageFormatToTexFormat(Format);

	// calculate memory usage
	const int MemSize = Width * Height * CImageInfo::GetPixelSize(Format);

	// copy texture data
	void *pTmpData = mem_alloc(MemSize);
	mem_copy(pTmpData, pData, MemSize);
	Cmd.m_pData = pTmpData;

	//
	m_pCommandBuffer->AddCommand(Cmd);
	return 0;
}